

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qselect.c
# Opt level: O1

double dqselect(int n,double *A,int k)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar4;
  
  if (1 < n) {
    if (k < 1) {
      k = 0;
    }
    if ((int)(n - 1U) <= k) {
      k = n - 1U;
    }
    do {
      uVar3 = n - 1;
      uVar4 = (ulong)uVar3;
      dVar1 = A[uVar4];
      uVar9 = uVar3;
      if (1 < (uint)n) {
        lVar8 = 0;
        do {
          uVar9 = (int)lVar8 - 1;
          lVar5 = (long)(int)lVar8;
          do {
            lVar8 = lVar5;
            dVar2 = A[lVar8];
            uVar9 = uVar9 + 1;
            if (dVar2 < dVar1) break;
            lVar5 = lVar8 + 1;
          } while (lVar8 < (int)uVar4);
          if (dVar2 < dVar1) {
            A[(int)uVar4] = dVar2;
            uVar4 = (ulong)uVar9;
          }
          lVar5 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          do {
            lVar6 = lVar5;
            dVar2 = A[lVar6];
            uVar3 = uVar3 - 1;
            if (dVar1 < dVar2) break;
            lVar5 = lVar6 + -1;
          } while ((int)uVar4 < lVar6);
          if (dVar1 < dVar2) {
            A[(int)uVar4] = dVar2;
            uVar4 = (ulong)uVar3;
          }
          uVar9 = (uint)uVar4;
        } while (lVar8 < lVar6);
      }
      A[(int)uVar9] = dVar1;
      if (uVar9 == k) {
        return dVar1;
      }
      iVar7 = uVar9 + 1;
      n = n - iVar7;
      if (k < (int)uVar9) {
        iVar7 = 0;
        n = uVar9;
      }
      A = A + iVar7;
      k = k - iVar7;
    } while (1 < n);
  }
  return *A;
}

Assistant:

double dqselect(int n, double A[], int k)
{
    register int i, j, p;
    register double val;

    k = SUPERLU_MAX(k, 0);
    k = SUPERLU_MIN(k, n - 1);
    while (n > 1)
    {
	i = 0; j = n-1;
	p = j; val = A[p];
	while (i < j)
	{
	    for (; A[i] >= val && i < p; i++);
	    if (A[i] < val) { A[p] = A[i]; p = i; }
	    for (; A[j] <= val && j > p; j--);
	    if (A[j] > val) { A[p] = A[j]; p = j; }
	}
	A[p] = val;
	if (p == k) return val;
	else if (p > k) n = p;
	else
	{
	    p++;
	    n -= p; A += p; k -= p;
	}
    }

    return A[0];
}